

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

void __thiscall
level_mesh::merge_orphans
          (level_mesh *this,b_submesh_vec *orphans,size_t num_groups,bool consider_gamemtl)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  pointer ppbVar8;
  b_submesh *instance1;
  pointer pbVar9;
  pointer pbVar10;
  pointer p_Var11;
  pointer ppbVar12;
  b_face_vec_it it1;
  pointer pbVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  pointer ppbVar17;
  uint uVar18;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ulong uVar19;
  
  ppbVar17 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppbVar8 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppbVar17 != ppbVar8) {
    xray_re::msg("merging %Iu orphan(s)",(long)ppbVar8 - (long)ppbVar17 >> 3);
    ppbVar17 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppbVar8 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppbVar17 != ppbVar8) {
      uVar1 = this->m_free_tag;
      do {
        instance1 = *ppbVar17;
        pbVar9 = (this->super_xr_mesh_builder).m_faces.
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (this->super_xr_mesh_builder).m_faces.
                  super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar9 == pbVar10) {
          uVar18 = 0xffffffff;
          fVar21 = 3.4028235e+38;
          fVar23 = 3.4028235e+38;
          uVar16 = 0xffffffff;
        }
        else {
          uVar14 = (ulong)(instance1->super_b_model_instance).min_face;
          p_Var11 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar15 = uVar14 * 0x40;
          uVar2 = pbVar9[uVar14].field_0.field_0.v[0];
          uVar3 = pbVar9[uVar14].field_0.field_0.v[1];
          uVar4 = pbVar9[uVar14].field_0.field_0.v[2];
          uVar16 = 0xffffffff;
          fVar23 = 3.4028235e+38;
          fVar21 = 3.4028235e+38;
          pbVar13 = pbVar9;
          uVar20 = 0xffffffff;
          do {
            if (lVar15 == 0) {
LAB_001280a6:
              uVar19 = uVar20;
              fVar22 = fVar21;
            }
            else {
              uVar18 = pbVar13->tag;
              if ((uVar18 < uVar1) || (((int)num_groups + uVar1) - 1 < uVar18)) goto LAB_001280a6;
              uVar5 = (pbVar13->field_0).field_0.v[0];
              uVar6 = (pbVar13->field_0).field_0.v[1];
              uVar7 = (pbVar13->field_0).field_0.v[2];
              fVar25 = (p_Var11[uVar2].field_0.field_0.x + p_Var11[uVar3].field_0.field_0.x +
                       p_Var11[uVar4].field_0.field_0.x) * 0.33333334 -
                       (p_Var11[uVar5].field_0.field_0.x + p_Var11[uVar6].field_0.field_0.x +
                       p_Var11[uVar7].field_0.field_0.x) * 0.33333334;
              fVar22 = (p_Var11[uVar2].field_0.field_0.y + p_Var11[uVar3].field_0.field_0.y +
                       p_Var11[uVar4].field_0.field_0.y) * 0.33333334 -
                       (p_Var11[uVar5].field_0.field_0.y + p_Var11[uVar6].field_0.field_0.y +
                       p_Var11[uVar7].field_0.field_0.y) * 0.33333334;
              fVar24 = (p_Var11[uVar2].field_0.field_0.z + p_Var11[uVar3].field_0.field_0.z +
                       p_Var11[uVar4].field_0.field_0.z) * 0.33333334 -
                       (p_Var11[uVar5].field_0.field_0.z + p_Var11[uVar6].field_0.field_0.z +
                       p_Var11[uVar7].field_0.field_0.z) * 0.33333334;
              fVar22 = SQRT(fVar24 * fVar24 + fVar25 * fVar25 + fVar22 * fVar22);
              if (fVar22 < fVar23) {
                uVar16 = (ulong)uVar18;
                fVar23 = fVar22;
              }
              if (((!consider_gamemtl) || (fVar21 <= fVar22)) ||
                 (uVar19 = (ulong)uVar18,
                 *(short *)((long)&pbVar13->field_1 + 4) !=
                 *(short *)((long)&pbVar9[uVar14].field_1 + 4))) goto LAB_001280a6;
            }
            fVar21 = fVar22;
            uVar18 = (uint)uVar19;
            pbVar13 = pbVar13 + 1;
            lVar15 = lVar15 + -0x40;
            uVar20 = uVar19;
          } while (pbVar13 != pbVar10);
        }
        ppbVar17 = ppbVar17 + 1;
        if (consider_gamemtl && uVar18 != 0xffffffff) {
          uVar16 = (ulong)uVar18;
          fVar23 = fVar21;
        }
        xray_re::msg("nearest: %u (%.2f)",SUB84((double)fVar23,0),uVar16);
        ppbVar12 = (this->m_instances).
                   super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->m_instances).
                          super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppbVar12 >> 3) <=
            uVar16) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar16);
        }
        merge(this,ppbVar12[uVar16],&instance1->super_b_model_instance);
        if (instance1 != (b_submesh *)0x0) {
          Opcode::Model::~Model(&instance1->opc_model);
          Opcode::MeshInterface::~MeshInterface(&instance1->opc_mesh);
        }
        operator_delete(instance1,0xe0);
      } while (ppbVar17 != ppbVar8);
      ppbVar17 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    }
    ppbVar8 = (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (orphans->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppbVar17 != (pointer)0x0) {
      operator_delete(ppbVar17,(long)ppbVar8 - (long)ppbVar17);
      return;
    }
  }
  return;
}

Assistant:

void level_mesh::merge_orphans(b_submesh_vec& orphans, size_t num_groups, bool consider_gamemtl)
{
	if (orphans.empty())
		return;
	msg("merging %" PRIuSIZET " orphan(s)", orphans.size());
	uint32_t min_tag = m_free_tag, max_tag = min_tag + uint32_t(num_groups & UINT32_MAX) - 1;
	for (b_submesh_vec_it it = orphans.begin(), end = orphans.end(); it != end;) {
		b_submesh* sm = *it++;
		const b_face* face = &m_faces[sm->min_face];
		fvector3 p;
		p.calc_center(m_points[face->v0], m_points[face->v1], m_points[face->v2]);
		uint32_t tag1 = BAD_IDX, tag2 = tag1;
		float min_dist1 = xr_numeric_limits<float>::max(), min_dist2 = min_dist1;
		for (b_face_vec_it it1 = m_faces.begin(), end1 = m_faces.end(); it1 != end1; ++it1) {
			uint32_t tag;
			if ((tag = it1->tag) >= min_tag && tag <= max_tag && face != &*it1) {
				float dist = fvector3().calc_center(m_points[it1->v0], m_points[it1->v1], m_points[it1->v2]).distance(p);
				if (min_dist1 > dist) {
					min_dist1 = dist;
					tag1 = tag;
				}
				if (consider_gamemtl && min_dist2 > dist &&
						it1->surface.gamemtl == face->surface.gamemtl) {
					min_dist2 = dist;
					tag2 = tag;
				}
			}
		}
		if (consider_gamemtl && tag2 != BAD_IDX) {
			tag1 = tag2;
			min_dist1 = min_dist2;
		}
		msg("nearest: %" PRIu32 " (%.2f)", tag1, min_dist1);
		merge(m_instances.at(tag1), sm);
		delete sm;
	}
	b_submesh_vec().swap(orphans);
}